

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::cpp::MessageGenerator::NeedsIsInitialized(MessageGenerator *this)

{
  pointer ppFVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  FieldGenerator *pFVar5;
  FieldDescriptor *field;
  pointer ppFVar6;
  Iterator __begin4;
  Iterator __end4;
  Iterator __begin3;
  Iterator __end3;
  Iterator local_70;
  Iterator local_60;
  Iterator local_50;
  Iterator local_40;
  
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (this->num_required_fields_ == 0 && this->descriptor_->extension_range_count_ == 0) {
      ppFVar6 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (ppFVar6 == ppFVar1) {
          if (this->num_weak_fields_ != 0) {
            return true;
          }
          local_50.descriptor = this->descriptor_;
          local_50.idx = 0;
          local_40.idx = (local_50.descriptor)->real_oneof_decl_count_;
          local_40.descriptor = local_50.descriptor;
          do {
            bVar2 = cpp::operator!=(&local_50,&local_40);
            if (!bVar2) {
              return bVar2;
            }
            local_70.descriptor = OneOfRangeImpl::Iterator::operator*(&local_50);
            local_70.idx = 0;
            local_60.idx = (local_70.descriptor)->field_count_;
            local_60.descriptor = local_70.descriptor;
            while (bVar4 = protobuf::internal::operator!=(&local_70,&local_60), bVar4) {
              field = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::
                      Iterator::operator*(&local_70);
              pFVar5 = FieldGeneratorTable::get(&this->field_generators_,field);
              cVar3 = (**(code **)((long)((pFVar5->impl_)._M_t.
                                          super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                          .
                                          super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                         ._M_head_impl)->_vptr_FieldGeneratorBase + 0xd8))();
              if (cVar3 != '\0') {
                return bVar2;
              }
              local_70.idx = local_70.idx + 1;
            }
            local_50.idx = local_50.idx + 1;
          } while( true );
        }
        pFVar5 = FieldGeneratorTable::get(&this->field_generators_,*ppFVar6);
        cVar3 = (**(code **)((long)((pFVar5->impl_)._M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                                   ._M_head_impl)->_vptr_FieldGeneratorBase + 0xd8))();
        ppFVar6 = ppFVar6 + 1;
      } while (cVar3 == '\0');
    }
  }
  return bVar2;
}

Assistant:

bool MessageGenerator::NeedsIsInitialized() {
  if (HasSimpleBaseClass(descriptor_, options_)) return false;
  if (descriptor_->extension_range_count() != 0) return true;
  if (num_required_fields_ != 0) return true;

  for (const auto* field : optimized_order_) {
    if (field_generators_.get(field).NeedsIsInitialized()) return true;
  }
  if (num_weak_fields_ != 0) return true;

  for (const auto* oneof : OneOfRange(descriptor_)) {
    for (const auto* field : FieldRange(oneof)) {
      if (field_generators_.get(field).NeedsIsInitialized()) return true;
    }
  }

  return false;
}